

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::GroupNorm_x86_fma::forward_inplace(GroupNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ulong uVar4;
  float *pfVar5;
  uint uVar6;
  uint uVar7;
  float *pfVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [32];
  long lVar16;
  uint uVar17;
  undefined1 (*pauVar18) [32];
  long lVar19;
  undefined1 (*pauVar20) [32];
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  uint *puVar27;
  __m128 x64;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  undefined1 auVar132 [64];
  float fVar148;
  float fVar149;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar150;
  undefined1 auVar145 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar127 [32];
  undefined1 auVar129 [32];
  undefined1 auVar131 [32];
  
  auVar3 = _DAT_005a4c60;
  auVar2 = _DAT_005a4c40;
  iVar9 = bottom_top_blob->dims;
  iVar12 = (this->super_GroupNorm).group;
  uVar21 = (long)(this->super_GroupNorm).channels / (long)iVar12;
  uVar24 = uVar21 & 0xffffffff;
  uVar6 = (uint)uVar21;
  auVar110 = in_ZMM6._0_16_;
  if (iVar9 == 2) {
    if (0 < iVar12) {
      uVar7 = bottom_top_blob->w;
      uVar17 = uVar7 * uVar6;
      uVar10 = uVar17 & 0xfffffff8;
      lVar16 = 0;
      auVar108._8_8_ = 0x8000000000000000;
      auVar108._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(auVar110,auVar110);
      do {
        lVar19 = lVar16 * (int)uVar6;
        pauVar18 = (undefined1 (*) [32])
                   (bottom_top_blob->w * lVar19 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar134 = 0.0;
        fVar135 = 0.0;
        fVar123 = 0.0;
        fVar133 = 0.0;
        fVar136 = 0.0;
        fVar137 = 0.0;
        fVar138 = 0.0;
        fVar139 = 0.0;
        pauVar15 = pauVar18;
        uVar23 = 0;
        fVar148 = 0.0;
        fVar149 = 0.0;
        fVar150 = 0.0;
        fVar151 = 0.0;
        fVar152 = 0.0;
        fVar153 = 0.0;
        fVar154 = 0.0;
        fVar140 = 0.0;
        if (7 < (int)uVar17) {
          iVar9 = 7;
          do {
            fVar123 = fVar123 + *(float *)*pauVar15;
            fVar133 = fVar133 + *(float *)(*pauVar15 + 4);
            fVar134 = fVar134 + *(float *)(*pauVar15 + 8);
            fVar135 = fVar135 + *(float *)(*pauVar15 + 0xc);
            fVar136 = fVar136 + *(float *)(*pauVar15 + 0x10);
            fVar137 = fVar137 + *(float *)(*pauVar15 + 0x14);
            fVar138 = fVar138 + *(float *)(*pauVar15 + 0x18);
            fVar139 = fVar139 + *(float *)(*pauVar15 + 0x1c);
            pauVar15 = pauVar15 + 1;
            iVar9 = iVar9 + 8;
            uVar23 = uVar10;
            fVar148 = fVar123;
            fVar149 = fVar133;
            fVar150 = fVar134;
            fVar151 = fVar135;
            fVar152 = fVar136;
            fVar153 = fVar137;
            fVar154 = fVar138;
            fVar140 = fVar139;
          } while (iVar9 < (int)uVar17);
        }
        uVar11 = uVar23 | 3;
        auVar143 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar134 = auVar143._4_4_;
          fVar135 = auVar143._8_4_;
          fVar123 = auVar143._12_4_;
          if ((int)uVar17 <= (int)uVar11) break;
          auVar143._0_4_ = auVar143._0_4_ + *(float *)*pauVar15;
          auVar143._4_4_ = fVar134 + *(float *)(*pauVar15 + 4);
          auVar143._8_4_ = fVar135 + *(float *)(*pauVar15 + 8);
          auVar143._12_4_ = fVar123 + *(float *)(*pauVar15 + 0xc);
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar11 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        auVar39._0_4_ = fVar148 + fVar152;
        auVar39._4_4_ = fVar149 + fVar153;
        auVar39._8_4_ = fVar150 + fVar154;
        auVar39._12_4_ = fVar151 + fVar140;
        auVar41 = vshufpd_avx(auVar39,auVar39,1);
        auVar40._0_4_ = auVar41._0_4_ + auVar39._0_4_;
        auVar40._4_4_ = auVar41._4_4_ + auVar39._4_4_;
        auVar40._8_4_ = auVar41._8_4_ + auVar39._8_4_;
        auVar40._12_4_ = auVar41._12_4_ + auVar39._12_4_;
        auVar41 = vshufpd_avx(auVar143,auVar143,1);
        auVar97._0_4_ = auVar143._0_4_ + auVar41._0_4_;
        auVar97._4_4_ = fVar134 + auVar41._4_4_;
        auVar97._8_4_ = fVar135 + auVar41._8_4_;
        auVar97._12_4_ = fVar123 + auVar41._12_4_;
        auVar143 = vhaddps_avx(auVar40,auVar40);
        auVar41 = vmovshdup_avx(auVar97);
        fVar134 = auVar143._0_4_ + auVar41._0_4_ + auVar97._0_4_;
        if ((int)uVar23 < (int)uVar17) {
          uVar21 = CONCAT44(0,~uVar23 + uVar17);
          auVar143 = vblendps_avx(ZEXT416((uint)fVar134),_DAT_005a3030,0xe);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar21;
          auVar40 = vpshufd_avx(auVar41,0x44);
          auVar41 = vorps_avx(auVar40,auVar108);
          auVar39 = vorps_avx(auVar40,auVar108);
          uVar24 = 0;
          auVar158 = ZEXT1664(auVar143);
          do {
            auVar132 = auVar158;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar24;
            auVar143 = vpshufd_avx(auVar42,0x44);
            auVar68._16_16_ = auVar143;
            auVar68._0_16_ = auVar143;
            auVar160 = vorps_avx(auVar68,auVar2);
            auVar68 = vorps_avx(auVar68,auVar3);
            auVar143 = vorps_avx(auVar40,auVar108);
            auVar116._8_4_ = auVar68._24_4_;
            auVar116._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
            auVar116._12_4_ = auVar68._28_4_ ^ 0x80000000;
            auVar42 = vpcmpgtq_avx(auVar116,auVar143);
            auVar98._8_4_ = auVar68._8_4_;
            auVar167._8_4_ = auVar98._8_4_;
            auVar167._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
            auVar167._12_4_ = auVar68._12_4_ ^ 0x80000000;
            auVar97 = vpcmpgtq_avx(auVar167,auVar41);
            auVar97 = vpackssdw_avx(auVar97,auVar42);
            auVar175._0_8_ = auVar160._16_8_ ^ 0x8000000000000000;
            auVar175._8_4_ = auVar160._24_4_;
            auVar175._12_4_ = auVar160._28_4_ ^ 0x80000000;
            auVar116 = vpcmpgtq_avx(auVar175,auVar143);
            auVar176._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
            auVar176._8_4_ = auVar160._8_4_;
            auVar176._12_4_ = auVar160._12_4_ ^ 0x80000000;
            auVar143 = vpcmpgtq_avx(auVar176,auVar39);
            auVar143 = vpackssdw_avx(auVar143,auVar116);
            auVar143 = vpackssdw_avx(auVar143 ^ auVar110,auVar97 ^ auVar110);
            auVar97 = vpmovsxwd_avx(auVar143);
            auVar143 = vpunpckhwd_avx(auVar143,auVar143);
            auVar171._16_16_ = auVar143;
            auVar171._0_16_ = auVar97;
            auVar171 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(*pauVar15 + uVar24 * 4));
            auVar125._0_4_ = auVar171._0_4_ + auVar132._0_4_;
            auVar125._4_4_ = auVar171._4_4_ + auVar132._4_4_;
            auVar125._8_4_ = auVar171._8_4_ + auVar132._8_4_;
            auVar125._12_4_ = auVar171._12_4_ + auVar132._12_4_;
            auVar129._16_4_ = auVar171._16_4_ + auVar132._16_4_;
            auVar129._0_16_ = auVar125;
            auVar129._20_4_ = auVar171._20_4_ + auVar132._20_4_;
            auVar129._24_4_ = auVar171._24_4_ + auVar132._24_4_;
            auVar129._28_4_ = auVar171._28_4_ + auVar132._28_4_;
            uVar24 = uVar24 + 8;
            auVar158 = ZEXT3264(auVar129);
          } while ((uVar21 + 8 & 0x1fffffff8) != uVar24);
          auVar143 = vorps_avx(auVar40,auVar108);
          auVar98._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
          auVar98._12_4_ = auVar68._12_4_ ^ 0x80000000;
          auVar143 = vpcmpgtq_avx(auVar98,auVar143);
          auVar41 = vpackssdw_avx(auVar143,auVar42);
          auVar143 = vorps_avx(auVar40,auVar108);
          auVar144._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
          auVar144._8_4_ = auVar160._8_4_;
          auVar144._12_4_ = auVar160._12_4_ ^ 0x80000000;
          auVar143 = vpcmpgtq_avx(auVar144,auVar143);
          auVar143 = vpackssdw_avx(auVar143,auVar116);
          auVar143 = vblendvps_avx(auVar132._0_16_,auVar125,auVar143 ^ auVar110);
          auVar41 = vblendvps_avx(auVar132._16_16_,auVar129._16_16_,auVar41 ^ auVar110);
          auVar143 = vhaddps_avx(auVar41,auVar143);
          auVar143 = vhaddps_avx(auVar143,auVar143);
          auVar143 = vhaddps_avx(auVar143,auVar143);
          fVar134 = auVar143._0_4_;
        }
        fVar134 = (1.0 / (float)(int)uVar17) * fVar134;
        auVar143 = vshufps_avx(ZEXT416((uint)fVar134),ZEXT416((uint)fVar134),0);
        pauVar15 = pauVar18;
        if ((int)uVar17 < 8) {
          auVar160 = SUB6432(ZEXT864(0),0);
          uVar23 = 0;
        }
        else {
          auVar69._16_16_ = auVar143;
          auVar69._0_16_ = auVar143;
          auVar158 = ZEXT864(0);
          iVar9 = 7;
          do {
            auVar160 = vsubps_avx(*pauVar15,auVar69);
            auVar41 = vfmadd231ps_fma(auVar158._0_32_,auVar160,auVar160);
            auVar158 = ZEXT1664(auVar41);
            auVar160 = ZEXT1632(auVar41);
            pauVar15 = pauVar15 + 1;
            iVar9 = iVar9 + 8;
            uVar23 = uVar10;
          } while (iVar9 < (int)uVar17);
        }
        auVar41 = ZEXT816(0) << 0x40;
        uVar11 = uVar23 | 3;
        while ((int)uVar11 < (int)uVar17) {
          auVar39 = vsubps_avx(*(undefined1 (*) [16])*pauVar15,auVar143);
          auVar41 = vfmadd231ps_fma(auVar41,auVar39,auVar39);
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar11 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        auVar43._0_4_ = auVar160._0_4_ + auVar160._16_4_;
        auVar43._4_4_ = auVar160._4_4_ + auVar160._20_4_;
        auVar43._8_4_ = auVar160._8_4_ + auVar160._24_4_;
        auVar43._12_4_ = auVar160._12_4_ + auVar160._28_4_;
        auVar39 = vshufpd_avx(auVar43,auVar43,1);
        auVar44._0_4_ = auVar39._0_4_ + auVar43._0_4_;
        auVar44._4_4_ = auVar39._4_4_ + auVar43._4_4_;
        auVar44._8_4_ = auVar39._8_4_ + auVar43._8_4_;
        auVar44._12_4_ = auVar39._12_4_ + auVar43._12_4_;
        auVar39 = vshufpd_avx(auVar41,auVar41,1);
        auVar99._0_4_ = auVar41._0_4_ + auVar39._0_4_;
        auVar99._4_4_ = auVar41._4_4_ + auVar39._4_4_;
        auVar99._8_4_ = auVar41._8_4_ + auVar39._8_4_;
        auVar99._12_4_ = auVar41._12_4_ + auVar39._12_4_;
        auVar41 = vhaddps_avx(auVar44,auVar44);
        auVar39 = vmovshdup_avx(auVar99);
        fVar135 = auVar41._0_4_ + auVar39._0_4_ + auVar99._0_4_;
        auVar41 = ZEXT416((uint)fVar135);
        if ((int)uVar23 < (int)uVar17) {
          uVar21 = CONCAT44(0,~uVar23 + uVar17);
          auVar41 = vblendps_avx(ZEXT416((uint)fVar135),_DAT_005a3030,0xe);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar21;
          auVar40 = vpshufd_avx(auVar45,0x44);
          auVar160._16_16_ = auVar143;
          auVar160._0_16_ = auVar143;
          auVar143 = vorps_avx(auVar40,auVar108);
          auVar39 = vorps_avx(auVar40,auVar108);
          uVar24 = 0;
          do {
            auVar98 = auVar41;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar24;
            auVar41 = vpshufd_avx(auVar46,0x44);
            auVar70._16_16_ = auVar41;
            auVar70._0_16_ = auVar41;
            auVar68 = vorps_avx(auVar70,auVar2);
            auVar171 = vorps_avx(auVar70,auVar3);
            auVar41 = vorps_avx(auVar40,auVar108);
            auVar117._0_8_ = auVar171._16_8_ ^ 0x8000000000000000;
            auVar117._8_4_ = auVar171._24_4_;
            auVar117._12_4_ = auVar171._28_4_ ^ 0x80000000;
            auVar42 = vpcmpgtq_avx(auVar117,auVar41);
            auVar182._0_8_ = auVar171._0_8_ ^ 0x8000000000000000;
            auVar100._8_4_ = auVar171._8_4_;
            auVar182._8_4_ = auVar100._8_4_;
            auVar182._12_4_ = auVar171._12_4_ ^ 0x80000000;
            auVar97 = vpcmpgtq_avx(auVar182,auVar143);
            auVar97 = vpackssdw_avx(auVar97,auVar42);
            auVar84._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
            auVar84._8_4_ = auVar68._24_4_;
            auVar84._12_4_ = auVar68._28_4_ ^ 0x80000000;
            auVar116 = vpcmpgtq_avx(auVar84,auVar41);
            auVar85._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
            auVar85._8_4_ = auVar68._8_4_;
            auVar85._12_4_ = auVar68._12_4_ ^ 0x80000000;
            auVar41 = vpcmpgtq_avx(auVar85,auVar39);
            auVar41 = vpackssdw_avx(auVar41,auVar116);
            auVar41 = vpackssdw_avx(auVar41 ^ auVar110,auVar97 ^ auVar110);
            auVar97 = vpmovsxwd_avx(auVar41);
            auVar41 = vpunpckhwd_avx(auVar41,auVar41);
            auVar91._16_16_ = auVar41;
            auVar91._0_16_ = auVar97;
            auVar129 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(*pauVar15 + uVar24 * 4));
            auVar129 = vsubps_avx(auVar129,auVar160);
            auVar41 = vfmadd213ps_fma(auVar129,auVar129,ZEXT1632(auVar98));
            uVar24 = uVar24 + 8;
          } while ((uVar21 + 8 & 0x1fffffff8) != uVar24);
          auVar143 = vorps_avx(auVar40,auVar108);
          auVar100._0_8_ = auVar171._0_8_ ^ 0x8000000000000000;
          auVar100._12_4_ = auVar171._12_4_ ^ 0x80000000;
          auVar143 = vpcmpgtq_avx(auVar100,auVar143);
          auVar39 = vpackssdw_avx(auVar143,auVar42);
          auVar143 = vorps_avx(auVar40,auVar108);
          auVar118._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
          auVar118._8_4_ = auVar68._8_4_;
          auVar118._12_4_ = auVar68._12_4_ ^ 0x80000000;
          auVar143 = vpcmpgtq_avx(auVar118,auVar143);
          auVar143 = vpackssdw_avx(auVar143,auVar116);
          auVar143 = vblendvps_avx(auVar98,auVar41,auVar143 ^ auVar110);
          auVar41 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar39 ^ auVar110);
          auVar143 = vhaddps_avx(auVar41,auVar143);
          auVar143 = vhaddps_avx(auVar143,auVar143);
          auVar41 = vhaddps_avx(auVar143,auVar143);
        }
        auVar143 = vfmadd213ss_fma(auVar41,ZEXT416((uint)(1.0 / (float)(int)uVar17)),
                                   ZEXT416((uint)(this->super_GroupNorm).eps));
        auVar143 = vsqrtss_avx(auVar143,auVar143);
        fVar135 = 1.0 / auVar143._0_4_;
        fVar134 = fVar135 * -fVar134;
        if ((this->super_GroupNorm).affine == 0) {
          auVar143 = vshufps_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),0);
          auVar41 = vshufps_avx(ZEXT416((uint)fVar134),ZEXT416((uint)fVar134),0);
          uVar23 = 0;
          if (7 < (int)uVar17) {
            auVar72._16_16_ = auVar143;
            auVar72._0_16_ = auVar143;
            auVar105._16_16_ = auVar41;
            auVar105._0_16_ = auVar41;
            iVar9 = 7;
            do {
              auVar39 = vfmadd132ps_fma(*pauVar18,auVar105,auVar72);
              *pauVar18 = ZEXT1632(auVar39);
              pauVar18 = pauVar18 + 1;
              iVar9 = iVar9 + 8;
              uVar23 = uVar10;
            } while (iVar9 < (int)uVar17);
          }
          uVar11 = uVar23 | 3;
          while ((int)uVar11 < (int)uVar17) {
            auVar39 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar18,auVar41,auVar143);
            *(undefined1 (*) [16])*pauVar18 = auVar39;
            pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
            uVar11 = uVar23 + 7;
            uVar23 = uVar23 + 4;
          }
          if ((int)uVar23 < (int)uVar17) {
            uVar21 = CONCAT44(0,~uVar23 + uVar17);
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar21;
            auVar39 = vpshufd_avx(auVar47,0x44);
            auVar147._16_16_ = auVar143;
            auVar147._0_16_ = auVar143;
            auVar130._16_16_ = auVar41;
            auVar130._0_16_ = auVar41;
            auVar143 = vorps_avx(auVar39,auVar108);
            auVar41 = vorps_avx(auVar39,auVar108);
            uVar24 = 0;
            do {
              auVar48._8_8_ = 0;
              auVar48._0_8_ = uVar24;
              auVar40 = vpshufd_avx(auVar48,0x44);
              auVar73._16_16_ = auVar40;
              auVar73._0_16_ = auVar40;
              auVar160 = vorps_avx(auVar73,auVar2);
              auVar68 = vorps_avx(auVar73,auVar3);
              auVar40 = vorps_avx(auVar39,auVar108);
              auVar119._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
              auVar119._8_4_ = auVar68._24_4_;
              auVar119._12_4_ = auVar68._28_4_ ^ 0x80000000;
              auVar97 = vpcmpgtq_avx(auVar119,auVar40);
              auVar49._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
              auVar49._8_4_ = auVar68._8_4_;
              auVar49._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar42 = vpcmpgtq_avx(auVar49,auVar143);
              auVar97 = vpackssdw_avx(auVar42,auVar97);
              auVar120._0_8_ = auVar160._16_8_ ^ 0x8000000000000000;
              auVar120._8_4_ = auVar160._24_4_;
              auVar120._12_4_ = auVar160._28_4_ ^ 0x80000000;
              auVar40 = vpcmpgtq_avx(auVar120,auVar40);
              auVar86._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
              auVar86._8_4_ = auVar160._8_4_;
              auVar86._12_4_ = auVar160._12_4_ ^ 0x80000000;
              auVar42 = vpcmpgtq_avx(auVar86,auVar41);
              auVar40 = vpackssdw_avx(auVar42,auVar40);
              auVar40 = vpackssdw_avx(auVar40 ^ auVar110,auVar97 ^ auVar110);
              auVar97 = vpmovsxwd_avx(auVar40);
              auVar40 = vpunpckhwd_avx(auVar40,auVar40);
              auVar74._16_16_ = auVar40;
              auVar74._0_16_ = auVar97;
              auVar160 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])(*pauVar18 + uVar24 * 4));
              auVar40 = vfmadd213ps_fma(auVar160,auVar147,auVar130);
              auVar160 = vmaskmovps_avx(auVar74,ZEXT1632(auVar40));
              *(undefined1 (*) [32])(*pauVar18 + uVar24 * 4) = auVar160;
              uVar24 = uVar24 + 8;
            } while ((uVar21 + 8 & 0x1fffffff8) != uVar24);
          }
        }
        else if (0 < (int)uVar6) {
          pfVar8 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar19 +
                            (long)(this->super_GroupNorm).gamma_data.data);
          puVar27 = (uint *)(lVar19 * (this->super_GroupNorm).beta_data.elemsize +
                            (long)(this->super_GroupNorm).beta_data.data);
          uVar23 = 0;
          do {
            fVar148 = *pfVar8 * fVar135;
            auVar39 = vfmadd213ss_fma(ZEXT416((uint)*pfVar8),ZEXT416((uint)fVar134),
                                      ZEXT416(*puVar27));
            auVar143 = vshufps_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),0);
            auVar41 = vshufps_avx(auVar39,auVar39,0);
            if ((int)uVar7 < 8) {
              uVar11 = 0;
            }
            else {
              auVar71._16_16_ = auVar143;
              auVar71._0_16_ = auVar143;
              auVar104._16_16_ = auVar41;
              auVar104._0_16_ = auVar41;
              iVar9 = 7;
              do {
                auVar40 = vfmadd132ps_fma(*pauVar18,auVar104,auVar71);
                *pauVar18 = ZEXT1632(auVar40);
                pauVar18 = pauVar18 + 1;
                iVar9 = iVar9 + 8;
                uVar11 = uVar7 & 0xfffffff8;
              } while (iVar9 < (int)uVar7);
            }
            uVar22 = uVar11 | 3;
            while ((int)uVar22 < (int)uVar7) {
              auVar40 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar18,auVar41,auVar143);
              *(undefined1 (*) [16])*pauVar18 = auVar40;
              pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
              uVar22 = uVar11 + 7;
              uVar11 = uVar11 + 4;
            }
            iVar9 = uVar7 - uVar11;
            if (iVar9 != 0 && (int)uVar11 <= (int)uVar7) {
              do {
                auVar143 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar18),auVar39,
                                           ZEXT416((uint)fVar148));
                *(int *)*pauVar18 = auVar143._0_4_;
                pauVar18 = (undefined1 (*) [32])(*pauVar18 + 4);
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
            }
            pfVar8 = pfVar8 + 1;
            puVar27 = puVar27 + 1;
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar6);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (this->super_GroupNorm).group);
    }
  }
  else if (iVar9 == 1) {
    if (0 < iVar12) {
      uVar7 = uVar6 & 0xfffffff8;
      lVar16 = 0;
      auVar107._8_8_ = 0x8000000000000000;
      auVar107._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(auVar110,auVar110);
      do {
        lVar19 = lVar16 * (int)uVar6;
        pauVar18 = (undefined1 (*) [32])
                   (bottom_top_blob->elemsize * lVar19 + (long)bottom_top_blob->data);
        fVar134 = 0.0;
        fVar135 = 0.0;
        fVar123 = 0.0;
        fVar133 = 0.0;
        fVar136 = 0.0;
        fVar137 = 0.0;
        fVar138 = 0.0;
        fVar139 = 0.0;
        pauVar15 = pauVar18;
        uVar17 = 0;
        fVar148 = 0.0;
        fVar149 = 0.0;
        fVar150 = 0.0;
        fVar151 = 0.0;
        fVar152 = 0.0;
        fVar153 = 0.0;
        fVar154 = 0.0;
        fVar140 = 0.0;
        if (7 < (int)uVar6) {
          iVar9 = 7;
          do {
            fVar123 = fVar123 + *(float *)*pauVar15;
            fVar133 = fVar133 + *(float *)(*pauVar15 + 4);
            fVar134 = fVar134 + *(float *)(*pauVar15 + 8);
            fVar135 = fVar135 + *(float *)(*pauVar15 + 0xc);
            fVar136 = fVar136 + *(float *)(*pauVar15 + 0x10);
            fVar137 = fVar137 + *(float *)(*pauVar15 + 0x14);
            fVar138 = fVar138 + *(float *)(*pauVar15 + 0x18);
            fVar139 = fVar139 + *(float *)(*pauVar15 + 0x1c);
            pauVar15 = pauVar15 + 1;
            iVar9 = iVar9 + 8;
            uVar17 = uVar7;
            fVar148 = fVar123;
            fVar149 = fVar133;
            fVar150 = fVar134;
            fVar151 = fVar135;
            fVar152 = fVar136;
            fVar153 = fVar137;
            fVar154 = fVar138;
            fVar140 = fVar139;
          } while (iVar9 < (int)uVar6);
        }
        uVar10 = uVar17 | 3;
        auVar141 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar134 = auVar141._4_4_;
          fVar135 = auVar141._8_4_;
          fVar123 = auVar141._12_4_;
          if ((int)uVar6 <= (int)uVar10) break;
          auVar141._0_4_ = auVar141._0_4_ + *(float *)*pauVar15;
          auVar141._4_4_ = fVar134 + *(float *)(*pauVar15 + 4);
          auVar141._8_4_ = fVar135 + *(float *)(*pauVar15 + 8);
          auVar141._12_4_ = fVar123 + *(float *)(*pauVar15 + 0xc);
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar10 = uVar17 + 7;
          uVar17 = uVar17 + 4;
        }
        auVar28._0_4_ = fVar148 + fVar152;
        auVar28._4_4_ = fVar149 + fVar153;
        auVar28._8_4_ = fVar150 + fVar154;
        auVar28._12_4_ = fVar151 + fVar140;
        auVar108 = vshufpd_avx(auVar28,auVar28,1);
        auVar29._0_4_ = auVar108._0_4_ + auVar28._0_4_;
        auVar29._4_4_ = auVar108._4_4_ + auVar28._4_4_;
        auVar29._8_4_ = auVar108._8_4_ + auVar28._8_4_;
        auVar29._12_4_ = auVar108._12_4_ + auVar28._12_4_;
        auVar108 = vshufpd_avx(auVar141,auVar141,1);
        auVar93._0_4_ = auVar141._0_4_ + auVar108._0_4_;
        auVar93._4_4_ = fVar134 + auVar108._4_4_;
        auVar93._8_4_ = fVar135 + auVar108._8_4_;
        auVar93._12_4_ = fVar123 + auVar108._12_4_;
        auVar108 = vhaddps_avx(auVar29,auVar29);
        auVar143 = vmovshdup_avx(auVar93);
        fVar134 = auVar108._0_4_ + auVar143._0_4_ + auVar93._0_4_;
        if ((int)uVar17 < (int)uVar6) {
          uVar21 = CONCAT44(0,~uVar17 + uVar6);
          auVar108 = vblendps_avx(ZEXT416((uint)fVar134),_DAT_005a3030,0xe);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar21;
          auVar39 = vpshufd_avx(auVar30,0x44);
          auVar143 = vorps_avx(auVar39,auVar107);
          auVar41 = vorps_avx(auVar39,auVar107);
          uVar24 = 0;
          auVar158 = ZEXT1664(auVar108);
          do {
            auVar132 = auVar158;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar24;
            auVar108 = vpshufd_avx(auVar31,0x44);
            auVar63._16_16_ = auVar108;
            auVar63._0_16_ = auVar108;
            auVar160 = vorps_avx(auVar63,auVar2);
            auVar68 = vorps_avx(auVar63,auVar3);
            auVar108 = vorps_avx(auVar39,auVar107);
            auVar111._8_4_ = auVar68._24_4_;
            auVar111._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
            auVar111._12_4_ = auVar68._28_4_ ^ 0x80000000;
            auVar97 = vpcmpgtq_avx(auVar111,auVar108);
            auVar94._8_4_ = auVar68._8_4_;
            auVar166._8_4_ = auVar94._8_4_;
            auVar166._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
            auVar166._12_4_ = auVar68._12_4_ ^ 0x80000000;
            auVar40 = vpcmpgtq_avx(auVar166,auVar143);
            auVar40 = vpackssdw_avx(auVar40,auVar97);
            auVar173._0_8_ = auVar160._16_8_ ^ 0x8000000000000000;
            auVar173._8_4_ = auVar160._24_4_;
            auVar173._12_4_ = auVar160._28_4_ ^ 0x80000000;
            auVar42 = vpcmpgtq_avx(auVar173,auVar108);
            auVar174._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
            auVar174._8_4_ = auVar160._8_4_;
            auVar174._12_4_ = auVar160._12_4_ ^ 0x80000000;
            auVar108 = vpcmpgtq_avx(auVar174,auVar41);
            auVar108 = vpackssdw_avx(auVar108,auVar42);
            auVar108 = vpackssdw_avx(auVar108 ^ auVar110,auVar40 ^ auVar110);
            auVar40 = vpmovsxwd_avx(auVar108);
            auVar108 = vpunpckhwd_avx(auVar108,auVar108);
            auVar169._16_16_ = auVar108;
            auVar169._0_16_ = auVar40;
            auVar171 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])(*pauVar15 + uVar24 * 4));
            auVar124._0_4_ = auVar171._0_4_ + auVar132._0_4_;
            auVar124._4_4_ = auVar171._4_4_ + auVar132._4_4_;
            auVar124._8_4_ = auVar171._8_4_ + auVar132._8_4_;
            auVar124._12_4_ = auVar171._12_4_ + auVar132._12_4_;
            auVar127._16_4_ = auVar171._16_4_ + auVar132._16_4_;
            auVar127._0_16_ = auVar124;
            auVar127._20_4_ = auVar171._20_4_ + auVar132._20_4_;
            auVar127._24_4_ = auVar171._24_4_ + auVar132._24_4_;
            auVar127._28_4_ = auVar171._28_4_ + auVar132._28_4_;
            uVar24 = uVar24 + 8;
            auVar158 = ZEXT3264(auVar127);
          } while ((uVar21 + 8 & 0x1fffffff8) != uVar24);
          auVar108 = vorps_avx(auVar39,auVar107);
          auVar94._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
          auVar94._12_4_ = auVar68._12_4_ ^ 0x80000000;
          auVar108 = vpcmpgtq_avx(auVar94,auVar108);
          auVar143 = vpackssdw_avx(auVar108,auVar97);
          auVar108 = vorps_avx(auVar39,auVar107);
          auVar142._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
          auVar142._8_4_ = auVar160._8_4_;
          auVar142._12_4_ = auVar160._12_4_ ^ 0x80000000;
          auVar108 = vpcmpgtq_avx(auVar142,auVar108);
          auVar108 = vpackssdw_avx(auVar108,auVar42);
          auVar108 = vblendvps_avx(auVar132._0_16_,auVar124,auVar108 ^ auVar110);
          auVar143 = vblendvps_avx(auVar132._16_16_,auVar127._16_16_,auVar143 ^ auVar110);
          auVar108 = vhaddps_avx(auVar143,auVar108);
          auVar108 = vhaddps_avx(auVar108,auVar108);
          auVar108 = vhaddps_avx(auVar108,auVar108);
          fVar134 = auVar108._0_4_;
        }
        fVar134 = (1.0 / (float)(int)uVar6) * fVar134;
        auVar108 = vshufps_avx(ZEXT416((uint)fVar134),ZEXT416((uint)fVar134),0);
        pauVar15 = pauVar18;
        if ((int)uVar6 < 8) {
          auVar160 = SUB6432(ZEXT864(0),0);
          uVar17 = 0;
        }
        else {
          auVar64._16_16_ = auVar108;
          auVar64._0_16_ = auVar108;
          auVar158 = ZEXT864(0);
          iVar9 = 7;
          do {
            auVar160 = vsubps_avx(*pauVar15,auVar64);
            auVar143 = vfmadd231ps_fma(auVar158._0_32_,auVar160,auVar160);
            auVar158 = ZEXT1664(auVar143);
            auVar160 = ZEXT1632(auVar143);
            pauVar15 = pauVar15 + 1;
            iVar9 = iVar9 + 8;
            uVar17 = uVar7;
          } while (iVar9 < (int)uVar6);
        }
        auVar143 = ZEXT816(0) << 0x40;
        uVar10 = uVar17 | 3;
        while ((int)uVar10 < (int)uVar6) {
          auVar41 = vsubps_avx(*(undefined1 (*) [16])*pauVar15,auVar108);
          auVar143 = vfmadd231ps_fma(auVar143,auVar41,auVar41);
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar10 = uVar17 + 7;
          uVar17 = uVar17 + 4;
        }
        auVar32._0_4_ = auVar160._0_4_ + auVar160._16_4_;
        auVar32._4_4_ = auVar160._4_4_ + auVar160._20_4_;
        auVar32._8_4_ = auVar160._8_4_ + auVar160._24_4_;
        auVar32._12_4_ = auVar160._12_4_ + auVar160._28_4_;
        auVar41 = vshufpd_avx(auVar32,auVar32,1);
        auVar33._0_4_ = auVar41._0_4_ + auVar32._0_4_;
        auVar33._4_4_ = auVar41._4_4_ + auVar32._4_4_;
        auVar33._8_4_ = auVar41._8_4_ + auVar32._8_4_;
        auVar33._12_4_ = auVar41._12_4_ + auVar32._12_4_;
        auVar41 = vshufpd_avx(auVar143,auVar143,1);
        auVar95._0_4_ = auVar143._0_4_ + auVar41._0_4_;
        auVar95._4_4_ = auVar143._4_4_ + auVar41._4_4_;
        auVar95._8_4_ = auVar143._8_4_ + auVar41._8_4_;
        auVar95._12_4_ = auVar143._12_4_ + auVar41._12_4_;
        auVar143 = vhaddps_avx(auVar33,auVar33);
        auVar41 = vmovshdup_avx(auVar95);
        fVar135 = auVar143._0_4_ + auVar41._0_4_ + auVar95._0_4_;
        auVar143 = ZEXT416((uint)fVar135);
        if ((int)uVar17 < (int)uVar6) {
          uVar21 = CONCAT44(0,~uVar17 + uVar6);
          auVar143 = vblendps_avx(ZEXT416((uint)fVar135),_DAT_005a3030,0xe);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar21;
          auVar39 = vpshufd_avx(auVar34,0x44);
          auVar159._16_16_ = auVar108;
          auVar159._0_16_ = auVar108;
          auVar108 = vorps_avx(auVar39,auVar107);
          auVar41 = vorps_avx(auVar39,auVar107);
          uVar24 = 0;
          do {
            auVar116 = auVar143;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar24;
            auVar143 = vpshufd_avx(auVar35,0x44);
            auVar65._16_16_ = auVar143;
            auVar65._0_16_ = auVar143;
            auVar160 = vorps_avx(auVar65,auVar2);
            auVar68 = vorps_avx(auVar65,auVar3);
            auVar143 = vorps_avx(auVar39,auVar107);
            auVar112._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
            auVar112._8_4_ = auVar68._24_4_;
            auVar112._12_4_ = auVar68._28_4_ ^ 0x80000000;
            auVar97 = vpcmpgtq_avx(auVar112,auVar143);
            auVar181._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
            auVar96._8_4_ = auVar68._8_4_;
            auVar181._8_4_ = auVar96._8_4_;
            auVar181._12_4_ = auVar68._12_4_ ^ 0x80000000;
            auVar40 = vpcmpgtq_avx(auVar181,auVar108);
            auVar40 = vpackssdw_avx(auVar40,auVar97);
            auVar80._0_8_ = auVar160._16_8_ ^ 0x8000000000000000;
            auVar80._8_4_ = auVar160._24_4_;
            auVar80._12_4_ = auVar160._28_4_ ^ 0x80000000;
            auVar42 = vpcmpgtq_avx(auVar80,auVar143);
            auVar81._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
            auVar81._8_4_ = auVar160._8_4_;
            auVar81._12_4_ = auVar160._12_4_ ^ 0x80000000;
            auVar143 = vpcmpgtq_avx(auVar81,auVar41);
            auVar143 = vpackssdw_avx(auVar143,auVar42);
            auVar143 = vpackssdw_avx(auVar143 ^ auVar110,auVar40 ^ auVar110);
            auVar40 = vpmovsxwd_avx(auVar143);
            auVar143 = vpunpckhwd_avx(auVar143,auVar143);
            auVar90._16_16_ = auVar143;
            auVar90._0_16_ = auVar40;
            auVar171 = vmaskmovps_avx(auVar90,*(undefined1 (*) [32])(*pauVar15 + uVar24 * 4));
            auVar171 = vsubps_avx(auVar171,auVar159);
            auVar143 = vfmadd213ps_fma(auVar171,auVar171,ZEXT1632(auVar116));
            uVar24 = uVar24 + 8;
          } while ((uVar21 + 8 & 0x1fffffff8) != uVar24);
          auVar108 = vorps_avx(auVar39,auVar107);
          auVar96._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
          auVar96._12_4_ = auVar68._12_4_ ^ 0x80000000;
          auVar108 = vpcmpgtq_avx(auVar96,auVar108);
          auVar41 = vpackssdw_avx(auVar108,auVar97);
          auVar108 = vorps_avx(auVar39,auVar107);
          auVar113._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
          auVar113._8_4_ = auVar160._8_4_;
          auVar113._12_4_ = auVar160._12_4_ ^ 0x80000000;
          auVar108 = vpcmpgtq_avx(auVar113,auVar108);
          auVar108 = vpackssdw_avx(auVar108,auVar42);
          auVar108 = vblendvps_avx(auVar116,auVar143,auVar108 ^ auVar110);
          auVar143 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar41 ^ auVar110);
          in_ZMM1 = ZEXT1664(auVar143);
          auVar108 = vhaddps_avx(auVar143,auVar108);
          auVar108 = vhaddps_avx(auVar108,auVar108);
          auVar143 = vhaddps_avx(auVar108,auVar108);
        }
        auVar108 = vfmadd213ss_fma(auVar143,ZEXT416((uint)(1.0 / (float)(int)uVar6)),
                                   ZEXT416((uint)(this->super_GroupNorm).eps));
        auVar108 = vsqrtss_avx(auVar108,auVar108);
        fVar135 = 1.0 / auVar108._0_4_;
        auVar41 = ZEXT416((uint)fVar135);
        fVar135 = fVar135 * -fVar134;
        auVar108 = vshufps_avx(auVar41,auVar41,0);
        auVar164._16_16_ = auVar108;
        auVar164._0_16_ = auVar108;
        auVar143 = vshufps_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),0);
        auVar170._16_16_ = auVar143;
        auVar170._0_16_ = auVar143;
        if ((this->super_GroupNorm).affine == 0) {
          uVar17 = 0;
          if (7 < (int)uVar6) {
            iVar9 = 7;
            do {
              auVar41 = vfmadd132ps_fma(*pauVar18,auVar170,auVar164);
              *pauVar18 = ZEXT1632(auVar41);
              pauVar18 = pauVar18 + 1;
              iVar9 = iVar9 + 8;
              uVar17 = uVar7;
            } while (iVar9 < (int)uVar6);
          }
          uVar10 = uVar17 | 3;
          while ((int)uVar10 < (int)uVar6) {
            auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar18,auVar143,auVar108);
            *(undefined1 (*) [16])*pauVar18 = auVar41;
            pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
            uVar10 = uVar17 + 7;
            uVar17 = uVar17 + 4;
          }
          if ((int)uVar17 < (int)uVar6) {
            uVar21 = CONCAT44(0,~uVar17 + uVar6);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar21;
            auVar41 = vpshufd_avx(auVar36,0x44);
            auVar128._16_16_ = auVar108;
            auVar128._0_16_ = auVar108;
            auVar146._16_16_ = auVar143;
            auVar146._0_16_ = auVar143;
            auVar108 = vorps_avx(auVar41,auVar107);
            auVar143 = vorps_avx(auVar41,auVar107);
            uVar24 = 0;
            do {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar24;
              auVar39 = vpshufd_avx(auVar37,0x44);
              auVar66._16_16_ = auVar39;
              auVar66._0_16_ = auVar39;
              auVar160 = vorps_avx(auVar66,auVar2);
              auVar68 = vorps_avx(auVar66,auVar3);
              auVar39 = vorps_avx(auVar41,auVar107);
              auVar114._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
              auVar114._8_4_ = auVar68._24_4_;
              auVar114._12_4_ = auVar68._28_4_ ^ 0x80000000;
              auVar40 = vpcmpgtq_avx(auVar114,auVar39);
              auVar38._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
              auVar38._8_4_ = auVar68._8_4_;
              auVar38._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar97 = vpcmpgtq_avx(auVar38,auVar108);
              auVar40 = vpackssdw_avx(auVar97,auVar40);
              auVar115._0_8_ = auVar160._16_8_ ^ 0x8000000000000000;
              auVar115._8_4_ = auVar160._24_4_;
              auVar115._12_4_ = auVar160._28_4_ ^ 0x80000000;
              auVar39 = vpcmpgtq_avx(auVar115,auVar39);
              auVar83._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
              auVar83._8_4_ = auVar160._8_4_;
              auVar83._12_4_ = auVar160._12_4_ ^ 0x80000000;
              auVar97 = vpcmpgtq_avx(auVar83,auVar143);
              auVar39 = vpackssdw_avx(auVar97,auVar39);
              auVar39 = vpackssdw_avx(auVar39 ^ auVar110,auVar40 ^ auVar110);
              auVar40 = vpmovsxwd_avx(auVar39);
              auVar39 = vpunpckhwd_avx(auVar39,auVar39);
              auVar67._16_16_ = auVar39;
              auVar67._0_16_ = auVar40;
              auVar160 = vmaskmovps_avx(auVar67,*(undefined1 (*) [32])(*pauVar18 + uVar24 * 4));
              auVar39 = vfmadd213ps_fma(auVar160,auVar128,auVar146);
              in_ZMM1 = ZEXT1664(auVar39);
              auVar160 = vmaskmovps_avx(auVar67,ZEXT1632(auVar39));
              *(undefined1 (*) [32])(*pauVar18 + uVar24 * 4) = auVar160;
              uVar24 = uVar24 + 8;
            } while ((uVar21 + 8 & 0x1fffffff8) != uVar24);
          }
        }
        else {
          pauVar15 = (undefined1 (*) [32])
                     ((this->super_GroupNorm).gamma_data.elemsize * lVar19 +
                     (long)(this->super_GroupNorm).gamma_data.data);
          pauVar20 = (undefined1 (*) [32])
                     (lVar19 * (this->super_GroupNorm).beta_data.elemsize +
                     (long)(this->super_GroupNorm).beta_data.data);
          fVar134 = auVar108._0_4_;
          fVar148 = auVar108._4_4_;
          fVar149 = auVar108._8_4_;
          uVar17 = 0;
          if (7 < (int)uVar6) {
            iVar9 = 7;
            do {
              auVar160 = *pauVar15;
              auVar158._0_4_ = fVar134 * auVar160._0_4_;
              auVar158._4_4_ = fVar148 * auVar160._4_4_;
              auVar158._8_4_ = fVar149 * auVar160._8_4_;
              auVar158._12_4_ = auVar108._12_4_ * auVar160._12_4_;
              auVar158._16_4_ = fVar134 * auVar160._16_4_;
              auVar158._20_4_ = fVar148 * auVar160._20_4_;
              auVar158._28_36_ = in_ZMM1._28_36_;
              auVar158._24_4_ = fVar149 * auVar160._24_4_;
              in_ZMM1 = ZEXT3264(auVar158._0_32_);
              auVar39 = vfmadd213ps_fma(auVar160,auVar170,*pauVar20);
              auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar158._0_32_,*pauVar18);
              *pauVar18 = ZEXT1632(auVar39);
              pauVar15 = pauVar15 + 1;
              pauVar20 = pauVar20 + 1;
              pauVar18 = pauVar18 + 1;
              iVar9 = iVar9 + 8;
              uVar17 = uVar7;
            } while (iVar9 < (int)uVar6);
          }
          uVar10 = uVar17 | 3;
          while ((int)uVar10 < (int)uVar6) {
            auVar39 = *(undefined1 (*) [16])*pauVar15;
            auVar82._0_4_ = fVar134 * auVar39._0_4_;
            auVar82._4_4_ = fVar148 * auVar39._4_4_;
            auVar82._8_4_ = fVar149 * auVar39._8_4_;
            auVar82._12_4_ = auVar108._12_4_ * auVar39._12_4_;
            in_ZMM1 = ZEXT1664(auVar82);
            auVar39 = vfmadd213ps_fma(auVar39,auVar143,*(undefined1 (*) [16])*pauVar20);
            auVar39 = vfmadd231ps_fma(auVar39,auVar82,*(undefined1 (*) [16])*pauVar18);
            *(undefined1 (*) [16])*pauVar18 = auVar39;
            pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
            pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
            pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
            uVar10 = uVar17 + 7;
            uVar17 = uVar17 + 4;
          }
          if ((int)uVar17 < (int)uVar6) {
            lVar19 = 0;
            do {
              auVar108 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar18 + lVar19 * 4)),
                                         ZEXT416((uint)fVar135),auVar41);
              auVar108 = vfmadd213ss_fma(auVar108,ZEXT416(*(uint *)(*pauVar15 + lVar19 * 4)),
                                         ZEXT416(*(uint *)(*pauVar20 + lVar19 * 4)));
              in_ZMM1 = ZEXT1664(auVar108);
              *(int *)(*pauVar18 + lVar19 * 4) = auVar108._0_4_;
              lVar19 = lVar19 + 1;
            } while (uVar6 - uVar17 != (int)lVar19);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (this->super_GroupNorm).group);
    }
  }
  else if ((iVar9 - 3U < 2) && (0 < iVar12)) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar17 = uVar7 & 0xfffffff8;
    fVar134 = 1.0 / (float)(int)(uVar7 * uVar6);
    lVar16 = 0;
    auVar158 = ZEXT1264(ZEXT812(0));
    auVar109._8_8_ = 0x8000000000000000;
    auVar109._0_8_ = 0x8000000000000000;
    auVar110 = vpcmpeqd_avx(auVar110,auVar110);
    do {
      lVar26 = lVar16 * (int)uVar6;
      uVar21 = bottom_top_blob->elemsize;
      lVar19 = bottom_top_blob->cstep * lVar26 * uVar21;
      pvVar1 = bottom_top_blob->data;
      uVar4 = ((long)bottom_top_blob->d * uVar21 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
              uVar21;
      pfVar8 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar26 +
                        (long)(this->super_GroupNorm).gamma_data.data);
      puVar27 = (uint *)(lVar26 * (this->super_GroupNorm).beta_data.elemsize +
                        (long)(this->super_GroupNorm).beta_data.data);
      if ((int)uVar6 < 1) {
        fVar135 = 0.0;
        auVar108 = ZEXT816(0) << 0x40;
      }
      else {
        lVar26 = uVar4 * uVar21;
        auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar13 = 0;
        do {
          pfVar5 = (float *)((long)pvVar1 + lVar26 * uVar13 + lVar19);
          if ((int)uVar7 < 8) {
            fVar135 = 0.0;
            fVar148 = 0.0;
            fVar149 = 0.0;
            fVar150 = 0.0;
            fVar151 = 0.0;
            fVar152 = 0.0;
            fVar153 = 0.0;
            fVar154 = 0.0;
            uVar10 = 0;
          }
          else {
            fVar135 = 0.0;
            fVar148 = 0.0;
            fVar149 = 0.0;
            fVar150 = 0.0;
            fVar151 = 0.0;
            fVar152 = 0.0;
            fVar153 = 0.0;
            fVar154 = 0.0;
            iVar9 = 7;
            do {
              fVar135 = fVar135 + *pfVar5;
              fVar148 = fVar148 + pfVar5[1];
              fVar149 = fVar149 + pfVar5[2];
              fVar150 = fVar150 + pfVar5[3];
              fVar151 = fVar151 + pfVar5[4];
              fVar152 = fVar152 + pfVar5[5];
              fVar153 = fVar153 + pfVar5[6];
              fVar154 = fVar154 + pfVar5[7];
              pfVar5 = pfVar5 + 8;
              iVar9 = iVar9 + 8;
              uVar10 = uVar17;
            } while (iVar9 < (int)uVar7);
          }
          uVar23 = uVar10 | 3;
          auVar155 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar140 = auVar155._4_4_;
            fVar123 = auVar155._8_4_;
            fVar133 = auVar155._12_4_;
            if ((int)uVar7 <= (int)uVar23) break;
            auVar155._0_4_ = auVar155._0_4_ + *pfVar5;
            auVar155._4_4_ = fVar140 + pfVar5[1];
            auVar155._8_4_ = fVar123 + pfVar5[2];
            auVar155._12_4_ = fVar133 + pfVar5[3];
            pfVar5 = pfVar5 + 4;
            uVar23 = uVar10 + 7;
            uVar10 = uVar10 + 4;
          }
          auVar50._0_4_ = fVar135 + fVar151;
          auVar50._4_4_ = fVar148 + fVar152;
          auVar50._8_4_ = fVar149 + fVar153;
          auVar50._12_4_ = fVar150 + fVar154;
          auVar108 = vshufpd_avx(auVar50,auVar50,1);
          auVar51._0_4_ = auVar108._0_4_ + auVar50._0_4_;
          auVar51._4_4_ = auVar108._4_4_ + auVar50._4_4_;
          auVar51._8_4_ = auVar108._8_4_ + auVar50._8_4_;
          auVar51._12_4_ = auVar108._12_4_ + auVar50._12_4_;
          auVar108 = vmovshdup_avx(auVar51);
          auVar143 = vshufpd_avx(auVar155,auVar155,1);
          auVar121._0_4_ = auVar155._0_4_ + auVar143._0_4_;
          auVar121._4_4_ = fVar140 + auVar143._4_4_;
          auVar121._8_4_ = fVar123 + auVar143._8_4_;
          auVar121._12_4_ = fVar133 + auVar143._12_4_;
          auVar143 = vmovshdup_avx(auVar121);
          fVar135 = auVar143._0_4_ +
                    auVar132._0_4_ + auVar108._0_4_ + auVar51._0_4_ + auVar121._0_4_;
          auVar132 = ZEXT464((uint)fVar135);
          if ((int)uVar10 < (int)uVar7) {
            uVar14 = CONCAT44(0,~uVar10 + uVar7);
            auVar52._8_8_ = 0;
            auVar52._0_8_ = uVar14;
            auVar41 = vpshufd_avx(auVar52,0x44);
            auVar108 = vorps_avx(auVar41,auVar109);
            auVar143 = vorps_avx(auVar41,auVar109);
            uVar25 = 0;
            auVar132 = ZEXT1664(CONCAT124(auVar158._4_12_,fVar135));
            do {
              auVar165 = auVar132;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = uVar25;
              auVar39 = vpshufd_avx(auVar53,0x44);
              auVar75._16_16_ = auVar39;
              auVar75._0_16_ = auVar39;
              auVar160 = vorps_avx(auVar75,auVar2);
              auVar68 = vorps_avx(auVar75,auVar3);
              auVar39 = vorps_avx(auVar41,auVar109);
              auVar87._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
              auVar87._8_4_ = auVar68._24_4_;
              auVar87._12_4_ = auVar68._28_4_ ^ 0x80000000;
              auVar97 = vpcmpgtq_avx(auVar87,auVar39);
              auVar168._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
              auVar54._8_4_ = auVar68._8_4_;
              auVar168._8_4_ = auVar54._8_4_;
              auVar168._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar40 = vpcmpgtq_avx(auVar168,auVar108);
              auVar40 = vpackssdw_avx(auVar40,auVar97);
              auVar177._0_8_ = auVar160._16_8_ ^ 0x8000000000000000;
              auVar177._8_4_ = auVar160._24_4_;
              auVar177._12_4_ = auVar160._28_4_ ^ 0x80000000;
              auVar42 = vpcmpgtq_avx(auVar177,auVar39);
              auVar178._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
              auVar178._8_4_ = auVar160._8_4_;
              auVar178._12_4_ = auVar160._12_4_ ^ 0x80000000;
              auVar39 = vpcmpgtq_avx(auVar178,auVar143);
              auVar39 = vpackssdw_avx(auVar39,auVar42);
              auVar39 = vpackssdw_avx(auVar39 ^ auVar110,auVar40 ^ auVar110);
              auVar40 = vpmovsxwd_avx(auVar39);
              auVar39 = vpunpckhwd_avx(auVar39,auVar39);
              auVar172._16_16_ = auVar39;
              auVar172._0_16_ = auVar40;
              auVar171 = vmaskmovps_avx(auVar172,*(undefined1 (*) [32])(pfVar5 + uVar25));
              auVar126._0_4_ = auVar171._0_4_ + auVar165._0_4_;
              auVar126._4_4_ = auVar171._4_4_ + auVar165._4_4_;
              auVar126._8_4_ = auVar171._8_4_ + auVar165._8_4_;
              auVar126._12_4_ = auVar171._12_4_ + auVar165._12_4_;
              auVar131._16_4_ = auVar171._16_4_ + auVar165._16_4_;
              auVar131._0_16_ = auVar126;
              auVar131._20_4_ = auVar171._20_4_ + auVar165._20_4_;
              auVar131._24_4_ = auVar171._24_4_ + auVar165._24_4_;
              auVar131._28_4_ = auVar171._28_4_ + auVar165._28_4_;
              uVar25 = uVar25 + 8;
              auVar132 = ZEXT3264(auVar131);
            } while ((uVar14 + 8 & 0x1fffffff8) != uVar25);
            auVar108 = vorps_avx(auVar41,auVar109);
            auVar54._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
            auVar54._12_4_ = auVar68._12_4_ ^ 0x80000000;
            auVar108 = vpcmpgtq_avx(auVar54,auVar108);
            auVar143 = vpackssdw_avx(auVar108,auVar97);
            auVar108 = vorps_avx(auVar41,auVar109);
            auVar145._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
            auVar145._8_4_ = auVar160._8_4_;
            auVar145._12_4_ = auVar160._12_4_ ^ 0x80000000;
            auVar108 = vpcmpgtq_avx(auVar145,auVar108);
            auVar108 = vpackssdw_avx(auVar108,auVar42);
            auVar108 = vblendvps_avx(auVar165._0_16_,auVar126,auVar108 ^ auVar110);
            auVar143 = vblendvps_avx(auVar165._16_16_,auVar131._16_16_,auVar143 ^ auVar110);
            auVar108 = vhaddps_avx(auVar143,auVar108);
            auVar108 = vhaddps_avx(auVar108,auVar108);
            auVar108 = vhaddps_avx(auVar108,auVar108);
            auVar132 = ZEXT1664(auVar108);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar24);
        fVar135 = auVar132._0_4_ * fVar134;
        if ((int)uVar6 < 1) {
          auVar108 = SUB6416(ZEXT864(0),0);
        }
        else {
          auVar143 = vshufps_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),0);
          auVar156._16_16_ = auVar143;
          auVar156._0_16_ = auVar143;
          auVar132 = ZEXT864(0);
          uVar13 = 0;
          do {
            pauVar18 = (undefined1 (*) [32])((long)pvVar1 + lVar26 * uVar13 + lVar19);
            if ((int)uVar7 < 8) {
              auVar160 = SUB6432(ZEXT864(0),0);
              uVar10 = 0;
            }
            else {
              auVar165 = ZEXT864(0);
              iVar9 = 7;
              do {
                auVar160 = vsubps_avx(*pauVar18,auVar156);
                auVar108 = vfmadd231ps_fma(auVar165._0_32_,auVar160,auVar160);
                auVar165 = ZEXT1664(auVar108);
                auVar160 = ZEXT1632(auVar108);
                pauVar18 = pauVar18 + 1;
                iVar9 = iVar9 + 8;
                uVar10 = uVar17;
              } while (iVar9 < (int)uVar7);
            }
            auVar108 = ZEXT816(0) << 0x40;
            uVar23 = uVar10 | 3;
            while ((int)uVar23 < (int)uVar7) {
              auVar41 = vsubps_avx(*(undefined1 (*) [16])*pauVar18,auVar143);
              auVar108 = vfmadd231ps_fma(auVar108,auVar41,auVar41);
              pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
              uVar23 = uVar10 + 7;
              uVar10 = uVar10 + 4;
            }
            auVar55._0_4_ = auVar160._0_4_ + auVar160._16_4_;
            auVar55._4_4_ = auVar160._4_4_ + auVar160._20_4_;
            auVar55._8_4_ = auVar160._8_4_ + auVar160._24_4_;
            auVar55._12_4_ = auVar160._12_4_ + auVar160._28_4_;
            auVar41 = vshufpd_avx(auVar55,auVar55,1);
            auVar56._0_4_ = auVar41._0_4_ + auVar55._0_4_;
            auVar56._4_4_ = auVar41._4_4_ + auVar55._4_4_;
            auVar56._8_4_ = auVar41._8_4_ + auVar55._8_4_;
            auVar56._12_4_ = auVar41._12_4_ + auVar55._12_4_;
            auVar41 = vmovshdup_avx(auVar56);
            auVar39 = vshufpd_avx(auVar108,auVar108,1);
            auVar122._0_4_ = auVar108._0_4_ + auVar39._0_4_;
            auVar122._4_4_ = auVar108._4_4_ + auVar39._4_4_;
            auVar122._8_4_ = auVar108._8_4_ + auVar39._8_4_;
            auVar122._12_4_ = auVar108._12_4_ + auVar39._12_4_;
            auVar108 = vmovshdup_avx(auVar122);
            fVar148 = auVar108._0_4_ +
                      auVar132._0_4_ + auVar41._0_4_ + auVar56._0_4_ + auVar122._0_4_;
            auVar132 = ZEXT464((uint)fVar148);
            if ((int)uVar10 < (int)uVar7) {
              uVar14 = CONCAT44(0,~uVar10 + uVar7);
              auVar162._4_12_ = auVar158._4_12_;
              auVar162._0_4_ = fVar148;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = uVar14;
              auVar39 = vpshufd_avx(auVar57,0x44);
              auVar108 = vorps_avx(auVar39,auVar109);
              auVar41 = vorps_avx(auVar39,auVar109);
              uVar25 = 0;
              do {
                auVar98 = auVar162;
                auVar58._8_8_ = 0;
                auVar58._0_8_ = uVar25;
                auVar40 = vpshufd_avx(auVar58,0x44);
                auVar76._16_16_ = auVar40;
                auVar76._0_16_ = auVar40;
                auVar160 = vorps_avx(auVar76,auVar2);
                auVar68 = vorps_avx(auVar76,auVar3);
                auVar40 = vorps_avx(auVar39,auVar109);
                auVar88._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
                auVar88._8_4_ = auVar68._24_4_;
                auVar88._12_4_ = auVar68._28_4_ ^ 0x80000000;
                auVar42 = vpcmpgtq_avx(auVar88,auVar40);
                auVar163._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
                auVar59._8_4_ = auVar68._8_4_;
                auVar163._8_4_ = auVar59._8_4_;
                auVar163._12_4_ = auVar68._12_4_ ^ 0x80000000;
                auVar97 = vpcmpgtq_avx(auVar163,auVar108);
                auVar97 = vpackssdw_avx(auVar97,auVar42);
                auVar101._0_8_ = auVar160._16_8_ ^ 0x8000000000000000;
                auVar101._8_4_ = auVar160._24_4_;
                auVar101._12_4_ = auVar160._28_4_ ^ 0x80000000;
                auVar116 = vpcmpgtq_avx(auVar101,auVar40);
                auVar102._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
                auVar102._8_4_ = auVar160._8_4_;
                auVar102._12_4_ = auVar160._12_4_ ^ 0x80000000;
                auVar40 = vpcmpgtq_avx(auVar102,auVar41);
                auVar40 = vpackssdw_avx(auVar40,auVar116);
                auVar40 = vpackssdw_avx(auVar40 ^ auVar110,auVar97 ^ auVar110);
                auVar97 = vpmovsxwd_avx(auVar40);
                auVar40 = vpunpckhwd_avx(auVar40,auVar40);
                auVar106._16_16_ = auVar40;
                auVar106._0_16_ = auVar97;
                auVar171 = vmaskmovps_avx(auVar106,*(undefined1 (*) [32])(*pauVar18 + uVar25 * 4));
                auVar171 = vsubps_avx(auVar171,auVar156);
                auVar162 = vfmadd213ps_fma(auVar171,auVar171,ZEXT1632(auVar98));
                uVar25 = uVar25 + 8;
              } while ((uVar14 + 8 & 0x1fffffff8) != uVar25);
              auVar108 = vorps_avx(auVar39,auVar109);
              auVar59._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
              auVar59._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar108 = vpcmpgtq_avx(auVar59,auVar108);
              auVar41 = vpackssdw_avx(auVar108,auVar42);
              auVar108 = vorps_avx(auVar39,auVar109);
              auVar103._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
              auVar103._8_4_ = auVar160._8_4_;
              auVar103._12_4_ = auVar160._12_4_ ^ 0x80000000;
              auVar108 = vpcmpgtq_avx(auVar103,auVar108);
              auVar108 = vpackssdw_avx(auVar108,auVar116);
              auVar108 = vblendvps_avx(auVar98,auVar162,auVar108 ^ auVar110);
              auVar41 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar41 ^ auVar110
                                     );
              auVar108 = vhaddps_avx(auVar41,auVar108);
              auVar108 = vhaddps_avx(auVar108,auVar108);
              auVar108 = vhaddps_avx(auVar108,auVar108);
              auVar132 = ZEXT1664(auVar108);
              auVar158 = ZEXT864(0);
            }
            auVar108 = auVar132._0_16_;
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar24);
        }
      }
      if (0 < (int)uVar6) {
        auVar108 = vfmadd213ss_fma(auVar108,ZEXT416((uint)fVar134),
                                   ZEXT416((uint)(this->super_GroupNorm).eps));
        auVar108 = vsqrtss_avx(auVar108,auVar108);
        fVar148 = 1.0 / auVar108._0_4_;
        uVar13 = 0;
        do {
          auVar108 = ZEXT416((uint)(fVar148 * -fVar135));
          fVar149 = fVar148;
          if ((this->super_GroupNorm).affine != 0) {
            fVar149 = fVar148 * *pfVar8;
            auVar108 = vfmadd213ss_fma(ZEXT416((uint)*pfVar8),auVar108,ZEXT416(*puVar27));
          }
          pauVar18 = (undefined1 (*) [32])((long)pvVar1 + uVar4 * uVar21 * uVar13 + lVar19);
          auVar143 = vshufps_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),0);
          auVar108 = vshufps_avx(auVar108,auVar108,0);
          uVar10 = 0;
          if (7 < (int)uVar7) {
            auVar77._16_16_ = auVar143;
            auVar77._0_16_ = auVar143;
            auVar92._16_16_ = auVar108;
            auVar92._0_16_ = auVar108;
            iVar9 = 7;
            do {
              auVar41 = vfmadd132ps_fma(*pauVar18,auVar92,auVar77);
              *pauVar18 = ZEXT1632(auVar41);
              pauVar18 = pauVar18 + 1;
              iVar9 = iVar9 + 8;
              uVar10 = uVar17;
            } while (iVar9 < (int)uVar7);
          }
          uVar23 = uVar10 | 3;
          while ((int)uVar23 < (int)uVar7) {
            auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar18,auVar108,auVar143);
            *(undefined1 (*) [16])*pauVar18 = auVar41;
            pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
            uVar23 = uVar10 + 7;
            uVar10 = uVar10 + 4;
          }
          if ((int)uVar10 < (int)uVar7) {
            uVar14 = CONCAT44(0,~uVar10 + uVar7);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar14;
            auVar41 = vpshufd_avx(auVar60,0x44);
            auVar161._16_16_ = auVar143;
            auVar161._0_16_ = auVar143;
            auVar157._16_16_ = auVar108;
            auVar157._0_16_ = auVar108;
            auVar108 = vorps_avx(auVar41,auVar109);
            auVar143 = vorps_avx(auVar41,auVar109);
            uVar25 = 0;
            do {
              auVar61._8_8_ = 0;
              auVar61._0_8_ = uVar25;
              auVar39 = vpshufd_avx(auVar61,0x44);
              auVar78._16_16_ = auVar39;
              auVar78._0_16_ = auVar39;
              auVar160 = vorps_avx(auVar78,auVar2);
              auVar68 = vorps_avx(auVar78,auVar3);
              auVar39 = vorps_avx(auVar41,auVar109);
              auVar179._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
              auVar179._8_4_ = auVar68._24_4_;
              auVar179._12_4_ = auVar68._28_4_ ^ 0x80000000;
              auVar40 = vpcmpgtq_avx(auVar179,auVar39);
              auVar62._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
              auVar62._8_4_ = auVar68._8_4_;
              auVar62._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar97 = vpcmpgtq_avx(auVar62,auVar108);
              auVar40 = vpackssdw_avx(auVar97,auVar40);
              auVar180._0_8_ = auVar160._16_8_ ^ 0x8000000000000000;
              auVar180._8_4_ = auVar160._24_4_;
              auVar180._12_4_ = auVar160._28_4_ ^ 0x80000000;
              auVar39 = vpcmpgtq_avx(auVar180,auVar39);
              auVar89._0_8_ = auVar160._0_8_ ^ 0x8000000000000000;
              auVar89._8_4_ = auVar160._8_4_;
              auVar89._12_4_ = auVar160._12_4_ ^ 0x80000000;
              auVar97 = vpcmpgtq_avx(auVar89,auVar143);
              auVar39 = vpackssdw_avx(auVar97,auVar39);
              auVar39 = vpackssdw_avx(auVar39 ^ auVar110,auVar40 ^ auVar110);
              auVar40 = vpmovsxwd_avx(auVar39);
              auVar39 = vpunpckhwd_avx(auVar39,auVar39);
              auVar79._16_16_ = auVar39;
              auVar79._0_16_ = auVar40;
              auVar160 = vmaskmovps_avx(auVar79,*(undefined1 (*) [32])(*pauVar18 + uVar25 * 4));
              auVar39 = vfmadd213ps_fma(auVar160,auVar161,auVar157);
              auVar160 = vmaskmovps_avx(auVar79,ZEXT1632(auVar39));
              *(undefined1 (*) [32])(*pauVar18 + uVar25 * 4) = auVar160;
              uVar25 = uVar25 + 8;
            } while ((uVar14 + 8 & 0x1fffffff8) != uVar25);
          }
          pfVar8 = pfVar8 + 1;
          puVar27 = puVar27 + 1;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar24);
        iVar12 = (this->super_GroupNorm).group;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar12);
  }
  return 0;
}

Assistant:

int GroupNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}